

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

void validate_primal_solution
               (Instance *instance,Solution *solution,int32_t min_num_customers_served)

{
  _Bool _Var1;
  double dVar2;
  double obj;
  double gap;
  int32_t min_num_customers_served_local;
  Solution *solution_local;
  Instance *instance_local;
  
  validate_tour(instance,&solution->tour,min_num_customers_served);
  dVar2 = solution_relgap(solution);
  _Var1 = fgte(dVar2,0.0,1e-06);
  if (!_Var1) {
    __assert_fail("fgte(gap, 0.0, 1e-6)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                  ,0x34,"void validate_primal_solution(const Instance *, Solution *, int32_t)");
  }
  dVar2 = tour_eval(instance,&solution->tour);
  _Var1 = feq(dVar2,solution->primal_bound,1e-05);
  if (!_Var1) {
    __assert_fail("feq(obj, solution->primal_bound, 1e-5)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                  ,0x39,"void validate_primal_solution(const Instance *, Solution *, int32_t)");
  }
  return;
}

Assistant:

void validate_primal_solution(const Instance *instance, Solution *solution,
                              int32_t min_num_customers_served) {
#ifndef NDEBUG

    validate_tour(instance, &solution->tour, min_num_customers_served);

    // Upper bound should be bigger than lower bound
    double gap = solution_relgap(solution);
    assert(fgte(gap, 0.0, 1e-6));

    // The recomputed objective value should be the same of what is stored
    // inside the solution
    double obj = tour_eval(instance, &solution->tour);
    assert(feq(obj, solution->primal_bound, 1e-5));

#else
    UNUSED_PARAM(instance);
    UNUSED_PARAM(solution);
    UNUSED_PARAM(min_num_customers_served);
#endif
}